

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

byte * __thiscall
Js::ByteCodeBufferReader::ReadSmallSpanSequence
          (ByteCodeBufferReader *this,byte *current,SmallSpanSequence **smallSpanSequence)

{
  HeapAllocator *alloc;
  SmallSpanSequence *this_00;
  byte *pbVar1;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&SmallSpanSequence::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_37b2ce4;
  data.filename._0_4_ = 0xe6b;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
  this_00 = (SmallSpanSequence *)new<Memory::HeapAllocator>(0x18,alloc,0x2ff150);
  SmallSpanSequence::SmallSpanSequence(this_00);
  *smallSpanSequence = this_00;
  pbVar1 = ReadInt32(current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),
                     &this_00->baseValue);
  pbVar1 = ReadGrowingUint32Array(this,pbVar1,&(*smallSpanSequence)->pStatementBuffer);
  pbVar1 = ReadGrowingUint32Array(this,pbVar1,&(*smallSpanSequence)->pActualOffsetList);
  return pbVar1;
}

Assistant:

const byte * ReadSmallSpanSequence(const byte * current, SmallSpanSequence ** smallSpanSequence)
    {
        (*smallSpanSequence) = HeapNew(SmallSpanSequence);
        current = ReadInt32(current, &(*smallSpanSequence)->baseValue);
        current = ReadGrowingUint32Array(current, &(*smallSpanSequence)->pStatementBuffer); // CONSIDER: It would be really nice to change GrowingUint32Array to something with a fixed, readonly layout
        current = ReadGrowingUint32Array(current, &(*smallSpanSequence)->pActualOffsetList);
        return current;
    }